

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_cube_texture
               (rf_texture2d texture,rf_vec3 position,float width,float height,float length,
               rf_color color)

{
  int iVar1;
  rf_render_batch *prVar2;
  long lVar3;
  rf_vertex_buffer *prVar4;
  rf_gfx_texcoord_data_type *prVar5;
  float x;
  float y;
  float z;
  float z_00;
  float local_48;
  float fStack_44;
  
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  if (prVar4[lVar3].elements_count * 4 <= prVar4[lVar3].v_counter + 0x24) {
    rf_gfx_draw();
  }
  fStack_44 = position.y;
  rf_gfx_enable_texture(texture.id);
  rf_gfx_begin(RF_QUADS);
  rf_gfx_color4ub(color.r,color.g,color.b,color.a);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 0.0;
  (prVar5 + (long)iVar1 * 2)[1] = 0.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  local_48 = position.x;
  x = local_48 - width * 0.5;
  y = fStack_44 - height * 0.5;
  z = length * 0.5 + position.z;
  rf_gfx_vertex3f(x,y,z);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 1.0;
  (prVar5 + (long)iVar1 * 2)[1] = 0.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  local_48 = width * 0.5 + local_48;
  rf_gfx_vertex3f(local_48,y,z);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 1.0;
  (prVar5 + (long)iVar1 * 2)[1] = 1.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  fStack_44 = height * 0.5 + fStack_44;
  rf_gfx_vertex3f(local_48,fStack_44,z);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 0.0;
  (prVar5 + (long)iVar1 * 2)[1] = 1.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(x,fStack_44,z);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 1.0;
  (prVar5 + (long)iVar1 * 2)[1] = 0.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  z_00 = position.z - length * 0.5;
  rf_gfx_vertex3f(x,y,z_00);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 1.0;
  (prVar5 + (long)iVar1 * 2)[1] = 1.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(x,fStack_44,z_00);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 0.0;
  (prVar5 + (long)iVar1 * 2)[1] = 1.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(local_48,fStack_44,z_00);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 0.0;
  (prVar5 + (long)iVar1 * 2)[1] = 0.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(local_48,y,z_00);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 0.0;
  (prVar5 + (long)iVar1 * 2)[1] = 1.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(x,fStack_44,z_00);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 0.0;
  (prVar5 + (long)iVar1 * 2)[1] = 0.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(x,fStack_44,z);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 1.0;
  (prVar5 + (long)iVar1 * 2)[1] = 0.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(local_48,fStack_44,z);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 1.0;
  (prVar5 + (long)iVar1 * 2)[1] = 1.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(local_48,fStack_44,z_00);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 1.0;
  (prVar5 + (long)iVar1 * 2)[1] = 1.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(x,y,z_00);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 0.0;
  (prVar5 + (long)iVar1 * 2)[1] = 1.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(local_48,y,z_00);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 0.0;
  (prVar5 + (long)iVar1 * 2)[1] = 0.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(local_48,y,z);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 1.0;
  (prVar5 + (long)iVar1 * 2)[1] = 0.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(x,y,z);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 1.0;
  (prVar5 + (long)iVar1 * 2)[1] = 0.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(local_48,y,z_00);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 1.0;
  (prVar5 + (long)iVar1 * 2)[1] = 1.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(local_48,fStack_44,z_00);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 0.0;
  (prVar5 + (long)iVar1 * 2)[1] = 1.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(local_48,fStack_44,z);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 0.0;
  (prVar5 + (long)iVar1 * 2)[1] = 0.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(local_48,y,z);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 0.0;
  (prVar5 + (long)iVar1 * 2)[1] = 0.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(x,y,z_00);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 1.0;
  (prVar5 + (long)iVar1 * 2)[1] = 0.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(x,y,z);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 1.0;
  (prVar5 + (long)iVar1 * 2)[1] = 1.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(x,fStack_44,z);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  (prVar5 + (long)iVar1 * 2)[0] = 0.0;
  (prVar5 + (long)iVar1 * 2)[1] = 1.0;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(x,fStack_44,z_00);
  rf_gfx_end();
  rf_gfx_disable_texture();
  return;
}

Assistant:

RF_API void rf_draw_cube_texture(rf_texture2d texture, rf_vec3 position, float width, float height, float length, rf_color color)
{
    float x = position.x;
    float y = position.y;
    float z = position.z;

    if (rf_gfx_check_buffer_limit(36)) rf_gfx_draw();

    rf_gfx_enable_texture(texture.id);

    //rf_gfx_push_matrix();
    // NOTE: Transformation is applied in inverse order (scale -> rotate -> translate)
    //rf_gfx_translatef(2.0f, 0.0f, 0.0f);
    //rf_gfx_rotatef(45, 0, 1, 0);
    //rf_gfx_scalef(2.0f, 2.0f, 2.0f);

    rf_gfx_begin(RF_QUADS);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    // Front Face
    rf_gfx_normal3f(0.0f, 0.0f, 1.0f); // Normal Pointing Towards Viewer
    rf_gfx_tex_coord2f(0.0f, 0.0f); rf_gfx_vertex3f(x - width/2, y - height/2, z + length/2); // Bottom Left Of The rf_texture and Quad
    rf_gfx_tex_coord2f(1.0f, 0.0f); rf_gfx_vertex3f(x + width/2, y - height/2, z + length/2); // Bottom Right Of The rf_texture and Quad
    rf_gfx_tex_coord2f(1.0f, 1.0f); rf_gfx_vertex3f(x + width/2, y + height/2, z + length/2); // Top Right Of The rf_texture and Quad
    rf_gfx_tex_coord2f(0.0f, 1.0f); rf_gfx_vertex3f(x - width/2, y + height/2, z + length/2); // Top Left Of The rf_texture and Quad
    // Back Face
    rf_gfx_normal3f(0.0f, 0.0f, - 1.0f); // Normal Pointing Away From Viewer
    rf_gfx_tex_coord2f(1.0f, 0.0f); rf_gfx_vertex3f(x - width/2, y - height/2, z - length/2); // Bottom Right Of The rf_texture and Quad
    rf_gfx_tex_coord2f(1.0f, 1.0f); rf_gfx_vertex3f(x - width/2, y + height/2, z - length/2); // Top Right Of The rf_texture and Quad
    rf_gfx_tex_coord2f(0.0f, 1.0f); rf_gfx_vertex3f(x + width/2, y + height/2, z - length/2); // Top Left Of The rf_texture and Quad
    rf_gfx_tex_coord2f(0.0f, 0.0f); rf_gfx_vertex3f(x + width/2, y - height/2, z - length/2); // Bottom Left Of The rf_texture and Quad
    // Top Face
    rf_gfx_normal3f(0.0f, 1.0f, 0.0f); // Normal Pointing Up
    rf_gfx_tex_coord2f(0.0f, 1.0f); rf_gfx_vertex3f(x - width/2, y + height/2, z - length/2); // Top Left Of The rf_texture and Quad
    rf_gfx_tex_coord2f(0.0f, 0.0f); rf_gfx_vertex3f(x - width/2, y + height/2, z + length/2); // Bottom Left Of The rf_texture and Quad
    rf_gfx_tex_coord2f(1.0f, 0.0f); rf_gfx_vertex3f(x + width/2, y + height/2, z + length/2); // Bottom Right Of The rf_texture and Quad
    rf_gfx_tex_coord2f(1.0f, 1.0f); rf_gfx_vertex3f(x + width/2, y + height/2, z - length/2); // Top Right Of The rf_texture and Quad
    // Bottom Face
    rf_gfx_normal3f(0.0f, - 1.0f, 0.0f); // Normal Pointing Down
    rf_gfx_tex_coord2f(1.0f, 1.0f); rf_gfx_vertex3f(x - width/2, y - height/2, z - length/2); // Top Right Of The rf_texture and Quad
    rf_gfx_tex_coord2f(0.0f, 1.0f); rf_gfx_vertex3f(x + width/2, y - height/2, z - length/2); // Top Left Of The rf_texture and Quad
    rf_gfx_tex_coord2f(0.0f, 0.0f); rf_gfx_vertex3f(x + width/2, y - height/2, z + length/2); // Bottom Left Of The rf_texture and Quad
    rf_gfx_tex_coord2f(1.0f, 0.0f); rf_gfx_vertex3f(x - width/2, y - height/2, z + length/2); // Bottom Right Of The rf_texture and Quad
    // Right face
    rf_gfx_normal3f(1.0f, 0.0f, 0.0f); // Normal Pointing Right
    rf_gfx_tex_coord2f(1.0f, 0.0f); rf_gfx_vertex3f(x + width/2, y - height/2, z - length/2); // Bottom Right Of The rf_texture and Quad
    rf_gfx_tex_coord2f(1.0f, 1.0f); rf_gfx_vertex3f(x + width/2, y + height/2, z - length/2); // Top Right Of The rf_texture and Quad
    rf_gfx_tex_coord2f(0.0f, 1.0f); rf_gfx_vertex3f(x + width/2, y + height/2, z + length/2); // Top Left Of The rf_texture and Quad
    rf_gfx_tex_coord2f(0.0f, 0.0f); rf_gfx_vertex3f(x + width/2, y - height/2, z + length/2); // Bottom Left Of The rf_texture and Quad
    // Left Face
    rf_gfx_normal3f(-1.0f, 0.0f, 0.0f); // Normal Pointing Left
    rf_gfx_tex_coord2f(0.0f, 0.0f); rf_gfx_vertex3f(x - width/2, y - height/2, z - length/2); // Bottom Left Of The rf_texture and Quad
    rf_gfx_tex_coord2f(1.0f, 0.0f); rf_gfx_vertex3f(x - width/2, y - height/2, z + length/2); // Bottom Right Of The rf_texture and Quad
    rf_gfx_tex_coord2f(1.0f, 1.0f); rf_gfx_vertex3f(x - width/2, y + height/2, z + length/2); // Top Right Of The rf_texture and Quad
    rf_gfx_tex_coord2f(0.0f, 1.0f); rf_gfx_vertex3f(x - width/2, y + height/2, z - length/2); // Top Left Of The rf_texture and Quad
    rf_gfx_end();
    //rf_gfx_pop_matrix();

    rf_gfx_disable_texture();
}